

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_reader.c
# Opt level: O2

int aom_video_reader_read_frame(AvxVideoReader *reader)

{
  VideoFileType VVar1;
  int iVar2;
  
  VVar1 = (reader->input_ctx).file_type;
  if (VVar1 == FILE_TYPE_OBU) {
    iVar2 = obudec_read_temporal_unit
                      (&reader->obu_ctx,&reader->buffer,&reader->frame_size,&reader->buffer_size);
  }
  else if (VVar1 == FILE_TYPE_WEBM) {
    iVar2 = webm_read_frame(&reader->webm_ctx,&reader->buffer,&reader->frame_size,
                            &reader->buffer_size);
  }
  else {
    if (VVar1 != FILE_TYPE_IVF) {
      return 0;
    }
    iVar2 = ivf_read_frame(&reader->input_ctx,&reader->buffer,&reader->frame_size,
                           &reader->buffer_size,&reader->pts);
  }
  return (uint)(iVar2 == 0);
}

Assistant:

int aom_video_reader_read_frame(AvxVideoReader *reader) {
  if (reader->input_ctx.file_type == FILE_TYPE_IVF) {
    return !ivf_read_frame(&reader->input_ctx, &reader->buffer,
                           &reader->frame_size, &reader->buffer_size,
                           &reader->pts);
  } else if (reader->input_ctx.file_type == FILE_TYPE_OBU) {
    return !obudec_read_temporal_unit(&reader->obu_ctx, &reader->buffer,
                                      &reader->frame_size,
                                      &reader->buffer_size);
#if CONFIG_WEBM_IO
  } else if (reader->input_ctx.file_type == FILE_TYPE_WEBM) {
    return !webm_read_frame(&reader->webm_ctx, &reader->buffer,
                            &reader->frame_size, &reader->buffer_size);
#endif
  } else {
    assert(0);
    return 0;
  }
}